

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_find_case(void)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_utf8(local_180,"key",0xffffffffffffffff,"value",0xffffffff);
  if (cVar1 == '\0') {
    pcVar3 = "bson_append_utf8 (&b, \"key\", -1, \"value\", -1)";
    uVar2 = 0x160;
  }
  else {
    cVar1 = bson_iter_init(auStack_200,local_180);
    if (cVar1 == '\0') {
      pcVar3 = "bson_iter_init (&iter, &b)";
      uVar2 = 0x161;
    }
    else {
      cVar1 = bson_iter_find_case(auStack_200,"KEY");
      if (cVar1 == '\0') {
        pcVar3 = "bson_iter_find_case (&iter, \"KEY\")";
        uVar2 = 0x162;
      }
      else {
        cVar1 = bson_iter_init(auStack_200,local_180);
        if (cVar1 == '\0') {
          pcVar3 = "bson_iter_init (&iter, &b)";
          uVar2 = 0x163;
        }
        else {
          cVar1 = bson_iter_find(auStack_200,"KEY");
          if (cVar1 == '\0') {
            bson_destroy(local_180);
            return;
          }
          pcVar3 = "!bson_iter_find (&iter, \"KEY\")";
          uVar2 = 0x164;
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar2,"test_bson_iter_find_case",pcVar3);
  abort();
}

Assistant:

static void
test_bson_iter_find_case (void)
{
   bson_t b;
   bson_iter_t iter;

   bson_init (&b);
   BSON_ASSERT (bson_append_utf8 (&b, "key", -1, "value", -1));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find_case (&iter, "KEY"));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (!bson_iter_find (&iter, "KEY"));
   bson_destroy (&b);
}